

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O0

void __thiscall SubprocessTestInterruptChild::Run(SubprocessTestInterruptChild *this)

{
  Test *this_00;
  bool bVar1;
  ExitStatus EVar2;
  Subprocess *pSVar3;
  allocator<char> local_39;
  string local_38;
  Subprocess *local_18;
  Subprocess *subproc;
  SubprocessTestInterruptChild *this_local;
  
  subproc = (Subprocess *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"kill -INT $$",&local_39);
  pSVar3 = SubprocessSet::Add(&(this->super_SubprocessTest).subprocs_,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  local_18 = pSVar3;
  bVar1 = testing::Test::Check
                    (g_current_test,pSVar3 != (Subprocess *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                     ,0x4f,"(Subprocess *) 0 != subproc");
  if (bVar1) {
    while (bVar1 = Subprocess::Done(local_18), this_00 = g_current_test, ((bVar1 ^ 0xffU) & 1) != 0)
    {
      SubprocessSet::DoWork(&(this->super_SubprocessTest).subprocs_);
    }
    EVar2 = Subprocess::Finish(local_18);
    testing::Test::Check
              (this_00,EVar2 == ExitInterrupted,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
               ,0x55,"ExitInterrupted == subproc->Finish()");
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(SubprocessTest, InterruptChild) {
  Subprocess* subproc = subprocs_.Add("kill -INT $$");
  ASSERT_NE((Subprocess *) 0, subproc);

  while (!subproc->Done()) {
    subprocs_.DoWork();
  }

  EXPECT_EQ(ExitInterrupted, subproc->Finish());
}